

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  char *local_138;
  bool local_111;
  cmAlphaNum local_110;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  cmAlphaNum local_c0;
  string local_90;
  byte local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  char *newExt_local;
  string *out_local;
  string *gnuName_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_38 = newExt;
  newExt_local = (char *)out;
  out_local = gnuName;
  gnuName_local = config;
  config_local = (string *)this;
  bVar2 = HasImplibGNUtoMS(this,config);
  local_59 = 0;
  local_111 = false;
  if (bVar2) {
    uVar3 = std::__cxx11::string::size();
    psVar1 = out_local;
    local_111 = false;
    if (6 < uVar3) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar1);
      local_59 = 1;
      local_111 = std::operator==(&local_58,".dll.a");
    }
  }
  if ((local_59 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if (local_111 == false) {
    this_local._7_1_ = false;
  }
  else {
    local_e0 = (basic_string_view<char,_std::char_traits<char>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)out_local);
    lVar4 = std::__cxx11::string::size();
    local_d0 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_e0,0,lVar4 - 6);
    cmAlphaNum::cmAlphaNum(&local_c0,local_d0);
    if (local_38 == (char *)0x0) {
      local_138 = ".lib";
    }
    else {
      local_138 = local_38;
    }
    cmAlphaNum::cmAlphaNum(&local_110,local_138);
    cmStrCat<>(&local_90,&local_c0,&local_110);
    std::__cxx11::string::operator=((string *)newExt_local,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = cmStrCat(cm::string_view(gnuName).substr(0, gnuName.size() - 6),
                   newExt ? newExt : ".lib");
    return true;
  }
  return false;
}